

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_3(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  allocator<char> local_71;
  shared_ptr<Pl_StdioFile> out;
  QPDFObjectHandle streams;
  QPDFObjectHandle stream;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&stream,"/QStreams",&local_71);
  QPDFObjectHandle::getKey((string *)&streams);
  std::__cxx11::string::~string((string *)&stream);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  iVar3 = 0;
  while( true ) {
    iVar1 = QPDFObjectHandle::getArrayNItems();
    if (iVar1 <= iVar3) break;
    QPDFObjectHandle::getArrayItem((int)(string *)&stream);
    poVar2 = std::operator<<((ostream *)&std::cout,"-- stream ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
    poVar2 = std::operator<<(poVar2," --");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    QUtil::binary_stdout();
    std::make_shared<Pl_StdioFile,char_const(&)[17],_IO_FILE*&>
              ((char (*) [17])&out,(_IO_FILE **)"tokenized stream");
    QPDFObjectHandle::pipeStreamData
              ((Pipeline *)&stream,
               (int)out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               qpdf_dl_specialized,true,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar3 = iVar3 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&streams.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_3(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle streams = pdf.getTrailer().getKey("/QStreams");
    for (int i = 0; i < streams.getArrayNItems(); ++i) {
        QPDFObjectHandle stream = streams.getArrayItem(i);
        std::cout << "-- stream " << i << " --" << std::endl;
        std::cout.flush();
        QUtil::binary_stdout();
        auto out = std::make_shared<Pl_StdioFile>("tokenized stream", stdout);
        stream.pipeStreamData(out.get(), qpdf_ef_normalize, qpdf_dl_generalized);
    }
}